

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityAssertFloatSpecial
               (UNITY_FLOAT actual,char *msg,UNITY_UINT lineNumber,UNITY_FLOAT_TRAIT_T style)

{
  bool bVar1;
  long lVar2;
  char *trait_names [4];
  char *local_38 [4];
  
  local_38[2] = "NaN";
  local_38[3] = "Determinate";
  local_38[0] = "Infinity";
  local_38[1] = "Negative Infinity";
  if (Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) {
    switch(style) {
    case UNITY_FLOAT_IS_NOT_INF:
    case UNITY_FLOAT_IS_INF:
      bVar1 = INFINITY <= actual;
      lVar2 = 0;
      break;
    case UNITY_FLOAT_IS_NOT_NEG_INF:
    case UNITY_FLOAT_IS_NEG_INF:
      bVar1 = actual <= -INFINITY;
      lVar2 = 1;
      break;
    case UNITY_FLOAT_IS_NOT_NAN:
    case UNITY_FLOAT_IS_NAN:
      bVar1 = NAN(actual);
      lVar2 = 2;
      break;
    case UNITY_FLOAT_IS_NOT_DET:
    case UNITY_FLOAT_IS_DET:
      bVar1 = (uint)ABS(actual) < 0x7f800000;
      lVar2 = 3;
      break;
    default:
      local_38[0] = "Invalid Float Trait";
      lVar2 = 0;
      goto LAB_00102392;
    }
    if (bVar1 != (bool)((byte)style & 1)) {
LAB_00102392:
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" Expected ");
      if ((style & UNITY_FLOAT_IS_INF) == UNITY_FLOAT_IS_NOT_INF) {
        UnityPrint("Not ");
      }
      UnityPrint(local_38[lVar2]);
      UnityPrint(" Was ");
      UnityPrintFloat(actual);
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
  }
  return;
}

Assistant:

void UnityAssertFloatSpecial(const UNITY_FLOAT actual,
                             const char* msg,
                             const UNITY_LINE_TYPE lineNumber,
                             const UNITY_FLOAT_TRAIT_T style)
{
    const char* trait_names[] = {UnityStrInf, UnityStrNegInf, UnityStrNaN, UnityStrDet};
    UNITY_INT should_be_trait = ((UNITY_INT)style & 1);
    UNITY_INT is_trait        = !should_be_trait;
    UNITY_INT trait_index     = (UNITY_INT)(style >> 1);

    RETURN_IF_FAIL_OR_IGNORE;

    switch (style)
    {
        case UNITY_FLOAT_IS_INF:
        case UNITY_FLOAT_IS_NOT_INF:
            is_trait = isinf(actual) && (actual > 0);
            break;
        case UNITY_FLOAT_IS_NEG_INF:
        case UNITY_FLOAT_IS_NOT_NEG_INF:
            is_trait = isinf(actual) && (actual < 0);
            break;

        case UNITY_FLOAT_IS_NAN:
        case UNITY_FLOAT_IS_NOT_NAN:
            is_trait = isnan(actual) ? 1 : 0;
            break;

        case UNITY_FLOAT_IS_DET: /* A determinate number is non infinite and not NaN. */
        case UNITY_FLOAT_IS_NOT_DET:
            is_trait = !isinf(actual) && !isnan(actual);
            break;

        default:
            trait_index = 0;
            trait_names[0] = UnityStrInvalidFloatTrait;
            break;
    }

    if (is_trait != should_be_trait)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrExpected);
        if (!should_be_trait)
        {
            UnityPrint(UnityStrNot);
        }
        UnityPrint(trait_names[trait_index]);
        UnityPrint(UnityStrWas);
#ifndef UNITY_EXCLUDE_FLOAT_PRINT
        UnityPrintFloat((UNITY_DOUBLE)actual);
#else
        if (should_be_trait)
        {
            UnityPrint(UnityStrNot);
        }
        UnityPrint(trait_names[trait_index]);
#endif
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}